

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall
kratos::PipelineInsertionVisitor::visit(PipelineInsertionVisitor *this,Generator *generator)

{
  size_t *this_00;
  element_type *peVar1;
  SequentialStmtBlock *this_01;
  StmtBlock *pSVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  uint uVar5;
  Var *pVVar6;
  _Base_ptr p_Var7;
  GeneratorException *this_02;
  uint uVar8;
  undefined1 auVar9 [8];
  pointer ppVar10;
  long lVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  long lVar12;
  bool bVar13;
  basic_string_view<char> bVar14;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  undefined1 local_1a0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  undefined1 local_160 [8];
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  attributes;
  string clock_name;
  shared_ptr<kratos::Port> clock_port;
  undefined1 local_100 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  undefined1 auStack_d8 [8];
  vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
  blocks;
  undefined1 local_b8 [8];
  shared_ptr<kratos::Port> port;
  vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> vars;
  undefined1 auStack_88 [8];
  value_type next_stage;
  undefined1 auStack_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clock_names;
  
  attributes.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&clock_name._M_string_length;
  clock_name._M_dataplus._M_p = (pointer)0x0;
  clock_name._M_string_length._0_1_ = 0;
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
          *)local_160,&(generator->super_IRNode).attributes_);
  uVar8 = 0;
  bVar13 = false;
  for (auVar9 = local_160;
      auVar9 != (undefined1  [8])
                attributes.
                super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar9 = (undefined1  [8])((long)auVar9 + 0x10)) {
    bVar4 = std::operator==(&((((pointer)auVar9)->
                              super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->type_str,"pipeline");
    peVar1 = (((pointer)auVar9)->super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (bVar4) {
      uVar5 = std::__cxx11::stoi(&peVar1->value_str,(size_t *)0x0,10);
      if (0 < (int)uVar5) {
        uVar8 = uVar5;
      }
      bVar13 = (bool)(bVar13 | 0 < (int)uVar5);
    }
    else {
      bVar4 = std::operator==(&peVar1->type_str,"pipeline_clk");
      if (bVar4) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   &attributes.
                    super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  if (bVar13) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a0,&(generator->ports_)._M_t);
    if (clock_name._M_dataplus._M_p == (pointer)0x0) {
      Generator::get_ports_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_68,generator,Clock);
      if (auStack_68 !=
          (undefined1  [8])
          clock_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   &attributes.
                    super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_68);
      if (clock_name._M_dataplus._M_p == (pointer)0x0) {
        this_02 = (GeneratorException *)__cxa_allocate_exception(0x10);
        auStack_88 = (undefined1  [8])(generator->name)._M_dataplus._M_p;
        next_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(generator->name)._M_string_length;
        bVar14 = fmt::v7::to_string_view<char,_0>("Unable to find clock signal for generator {0}");
        format_str_00.data_ = (char *)bVar14.size_;
        format_str_00.size_ = 0xd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_88;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)auStack_68,(detail *)bVar14.data_,format_str_00,args_00);
        __l._M_len = 1;
        __l._M_array = (iterator)auStack_d8;
        auStack_d8 = (undefined1  [8])generator;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_88,__l,
                   (allocator_type *)
                   &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        GeneratorException::GeneratorException
                  (this_02,(string *)auStack_68,
                   (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_88);
        __cxa_throw(this_02,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    Generator::get_port((Generator *)((long)&clock_name.field_2 + 8),(string *)generator);
    auStack_d8 = (undefined1  [8])0x0;
    blocks.
    super__Vector_base<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    blocks.
    super__Vector_base<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppVar10 = (pointer)(ulong)uVar8;
    std::
    vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ::resize((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
              *)auStack_d8,(size_type)ppVar10);
    this_00 = &port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_100._16_8_ = ppVar10;
    for (lVar12 = 0; (long)ppVar10 << 4 != lVar12; lVar12 = lVar12 + 0x10) {
      std::make_shared<kratos::SequentialStmtBlock>();
      std::__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)auStack_d8 + lVar12),
                 (__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)auStack_68
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&clock_names);
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<kratos::SequentialStmtBlock,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
                 (__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)auStack_d8 + lVar12));
      Generator::add_stmt(generator,(shared_ptr<kratos::Stmt> *)this_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168);
      this_01 = *(SequentialStmtBlock **)((long)auStack_d8 + lVar12);
      auStack_68 = (undefined1  [8])((ulong)auStack_68 & 0xffffffff00000000);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Port,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&clock_names,
                 (__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&clock_name.field_2 + 8));
      SequentialStmtBlock::add_condition
                (this_01,(pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)auStack_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &clock_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      if (generator->debug == true) {
        auStack_68 = (undefined1  [8])0x229cd1;
        clock_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(clock_names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x242);
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::emplace_back<std::pair<char_const*,int>>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)(*(long *)((long)auStack_d8 + lVar12) + 8),
                   (pair<const_char_*,_int> *)auStack_68);
      }
    }
    lVar12 = (ulong)(uVar8 - 1) * 0x10;
    for (p_Var7 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 != (_Rb_tree_node_base *)&port_names;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      Generator::get_port((Generator *)local_b8,(string *)generator);
      if (*(int *)&(((Var *)((long)local_b8 + 0x270))->super_IRNode)._vptr_IRNode != 0) {
        port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
        resize((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                *)&port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_100._16_8_);
        lVar11 = 0;
        ppVar10 = (pointer)0x0;
        while ((pointer)local_100._16_8_ != ppVar10) {
          local_100._24_8_ = ppVar10;
          bVar14 = fmt::v7::to_string_view<char,_0>("stage_{0}");
          format_str.data_ = (char *)bVar14.size_;
          format_str.size_ = 2;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)(local_100 + 0x18);
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_88,(detail *)bVar14.data_,format_str,args);
          Generator::get_unique_variable_name
                    ((string *)auStack_68,generator,(string *)(p_Var7 + 1),(string *)auStack_88);
          clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar10;
          std::__cxx11::string::~string((string *)auStack_88);
          pVVar6 = Generator::var(generator,(string *)auStack_68,
                                  *(uint32_t *)((long)local_b8 + 0x98),
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  ((long)local_b8 + 0xa0),*(bool *)((long)local_b8 + 0xf0));
          _Var3 = clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
          if (generator->debug == true) {
            auStack_88 = (undefined1  [8])0x229cd1;
            next_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 CONCAT44(next_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr._4_4_,0x252);
            std::
            vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
            ::emplace_back<std::pair<char_const*,int>>
                      ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                        *)&(pVVar6->super_IRNode).fn_name_ln,(pair<const_char_*,_int> *)auStack_88);
          }
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_88,
                     (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     &pVVar6->super_enable_shared_from_this<kratos::Var>);
          std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar11),
                     (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_88);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&next_stage);
          std::__cxx11::string::~string((string *)auStack_68);
          lVar11 = lVar11 + 0x10;
          ppVar10 = (pointer)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + 1);
        }
        Var::move_src_to((Var *)local_b8,
                         (Var *)(port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base,generator,false);
        for (lVar11 = 0; lVar12 != lVar11; lVar11 = lVar11 + 0x10) {
          std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_68,
                     (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar11));
          std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_88,
                     (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar11));
          pSVar2 = *(StmtBlock **)((long)auStack_d8 + lVar11);
          Var::assign((Var *)local_100,(shared_ptr<kratos::Var> *)auStack_88,
                      (AssignmentType)(string *)auStack_68);
          local_100._24_8_ = local_100._0_8_;
          _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
          local_100._0_8_ = (pointer)0x0;
          local_100._8_8_ = (pointer)0x0;
          StmtBlock::add_stmt(pSVar2,(shared_ptr<kratos::Stmt> *)(local_100 + 0x18));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&next_stage);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&clock_names);
        }
        pSVar2 = *(StmtBlock **)((long)auStack_d8 + lVar12);
        Var::assign((Var *)auStack_88,(shared_ptr<kratos::Var> *)local_b8,
                    (int)port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + (int)lVar12);
        auStack_68 = auStack_88;
        clock_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)next_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auStack_88 = (undefined1  [8])0x0;
        next_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        StmtBlock::add_stmt(pSVar2,(shared_ptr<kratos::Stmt> *)auStack_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&clock_names);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&next_stage);
        std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
        ~vector((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                 *)&port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
    }
    std::
    vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ::~vector((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
               *)auStack_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&clock_port);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a0);
  }
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           *)local_160);
  std::__cxx11::string::~string
            ((string *)
             &attributes.
              super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void visit(Generator* generator) override {
        // only if the generator has attribute of "pipeline" and the value string is the
        // number of pipeline stages will do
        bool has_attribute = false;
        std::string clock_name;
        auto attributes = generator->get_attributes();
        uint32_t num_stages = 0;
        for (auto const& attr : attributes) {
            if (attr->type_str == "pipeline") {
                try {
                    int i = std::stoi(attr->value_str);
                    if (i > 0) {
                        num_stages = static_cast<uint32_t>(i);
                        has_attribute = true;
                    }
                } catch (std::invalid_argument const&) {
                    throw std::runtime_error(
                        ::format("Unable to get value string from generator {0}", generator->name));
                }
            } else if (attr->type_str == "pipeline_clk") {
                clock_name = attr->value_str;
            }
        }
        if (has_attribute) {
            auto port_names = generator->get_port_names();
            // get the clock name, if it's empty
            if (clock_name.empty()) {
                // pick the first one
                auto clock_names = generator->get_ports(PortType::Clock);
                if (!clock_names.empty()) clock_name = clock_names[0];
            }
            if (clock_name.empty()) {
                throw GeneratorException(
                    ::format("Unable to find clock signal for generator {0}", generator->name),
                    {generator});
            }
            auto clock_port = generator->get_port(clock_name);
            // we need to create all the registers based on the posedge of the clock
            std::vector<std::shared_ptr<SequentialStmtBlock>> blocks;
            blocks.resize(num_stages);
            for (uint32_t i = 0; i < num_stages; i++) {
                blocks[i] = std::make_shared<SequentialStmtBlock>();
                generator->add_stmt(blocks[i]);
                blocks[i]->add_condition({EventEdgeType::Posedge, clock_port});
                if (generator->debug)
                    blocks[i]->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // get all the outputs
            for (auto const& port_name : port_names) {
                auto port = generator->get_port(port_name);
                if (port->port_direction() == PortDirection::In) {
                    continue;
                }
                std::vector<std::shared_ptr<Var>> vars;
                vars.resize(num_stages);
                for (uint32_t i = 0; i < num_stages; i++) {
                    auto new_name =
                        generator->get_unique_variable_name(port_name, ::format("stage_{0}", i));
                    auto& var = generator->var(new_name, port->var_width(), port->size(),
                                               port->is_signed());
                    if (generator->debug)
                        var.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
                    vars[i] = var.shared_from_this();
                }
                // move the source to the first stage
                Var::move_src_to(port.get(), vars[0].get(), generator, false);
                // connect the stages together
                for (uint32_t i = 0; i < num_stages - 1; i++) {
                    auto pre_stage = vars[i];
                    auto next_stage = vars[i + 1];
                    blocks[i]->add_stmt(next_stage->assign(pre_stage, AssignmentType::NonBlocking));
                }
                // last stage
                blocks[num_stages - 1]->add_stmt(
                    port->assign(vars[num_stages - 1], AssignmentType::NonBlocking));
            }
        }
    }